

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void init::LogPackageVersion(void)

{
  long lVar1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  string version_string;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FormatFullVersion_abi_cxx11_();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&version_string," (release build)");
  logging_function._M_str = "LogPackageVersion";
  logging_function._M_len = 0x11;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp"
  ;
  source_file._M_len = 0x5f;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,0x95,ALL,Info,(ConstevalFormatString<1U>)0x866877,
             &version_string);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)version_string._M_dataplus._M_p != &version_string.field_2) {
    operator_delete(version_string._M_dataplus._M_p,version_string.field_2._M_allocated_capacity + 1
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LogPackageVersion()
{
    std::string version_string = FormatFullVersion();
#ifdef DEBUG
    version_string += " (debug build)";
#else
    version_string += " (release build)";
#endif
    LogPrintf(PACKAGE_NAME " version %s\n", version_string);
}